

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O1

void hal_record_scaling_list(scalingFactor_t *pScalingFactor_out,scalingList_t *pScalingList)

{
  RK_U8 (*paRVar1) [64];
  long lVar2;
  int iVar3;
  scalingList_t *psVar4;
  int iVar5;
  RK_U8 *pRVar6;
  scalingList_t *psVar7;
  uint uVar8;
  RK_U8 *pRVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  RK_U8 tmpBuf [64];
  
  lVar2 = 0;
  uVar8 = 0;
  psVar7 = pScalingList;
  do {
    iVar3 = (&DAT_002a44e0)[lVar2];
    lVar10 = 0x40;
    if (lVar2 == 0) {
      lVar10 = 0x10;
    }
    uVar12 = 0;
    psVar4 = psVar7;
    do {
      lVar11 = 0;
      if (lVar2 == 3) {
        do {
          pScalingFactor_out->scalingfactor0[uVar8 + (int)lVar11] = psVar4->sl[0][0][lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x40);
        uVar8 = uVar8 + 0x40;
        iVar5 = 0x80;
        do {
          uVar13 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          pScalingFactor_out->scalingfactor0[uVar13] = '\0';
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      else {
        do {
          pScalingFactor_out->scalingfactor0[uVar8 + (int)lVar11] = psVar4->sl[0][0][lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
        uVar8 = uVar8 + (int)lVar11;
      }
      uVar12 = uVar12 + 1;
      psVar4 = (scalingList_t *)(psVar4->sl[0] + 1);
    } while (uVar12 != iVar3 + (uint)(iVar3 == 0));
    lVar2 = lVar2 + 1;
    psVar7 = (scalingList_t *)(psVar7->sl + 1);
  } while (lVar2 != 4);
  lVar2 = 0;
  iVar3 = 0;
  do {
    paRVar1 = pScalingList->sl[0] + lVar2;
    local_78 = *(undefined8 *)*paRVar1;
    uStack_70 = *(undefined8 *)(*paRVar1 + 8);
    lVar10 = -0x10;
    pRVar9 = (RK_U8 *)((long)&uStack_70 + 4);
    do {
      iVar5 = (int)lVar10;
      pScalingFactor_out->scalingfactor1[iVar3 + iVar5 + 0x10] = pRVar9[-0xc];
      pScalingFactor_out->scalingfactor1[(uint)(iVar3 + 0x11 + iVar5)] = pRVar9[-8];
      pScalingFactor_out->scalingfactor1[(uint)(iVar3 + 0x12 + iVar5)] = pRVar9[-4];
      pScalingFactor_out->scalingfactor1[(uint)(iVar3 + 0x13 + iVar5)] = *pRVar9;
      pRVar9 = pRVar9 + 1;
      lVar10 = lVar10 + 4;
    } while (lVar10 != 0);
    lVar2 = lVar2 + 1;
    iVar3 = iVar3 + 0x10;
  } while (lVar2 != 6);
  lVar2 = 0;
  do {
    pScalingFactor_out->scalingdc[lVar2] = pScalingList->sl_dc[0][lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  pRVar9 = pScalingFactor_out->scalingdc + 8;
  lVar2 = 0;
  do {
    pRVar9[-2] = pScalingList->sl_dc[1][lVar2];
    pRVar9[-1] = '\0';
    pRVar9[0] = '\0';
    lVar2 = lVar2 + 1;
    pRVar9 = pRVar9 + 3;
  } while (lVar2 == 1);
  pScalingFactor_out->reserverd[0] = '\0';
  pScalingFactor_out->reserverd[1] = '\0';
  pScalingFactor_out->reserverd[2] = '\0';
  pScalingFactor_out->reserverd[3] = '\0';
  pRVar9 = pScalingFactor_out->scalingfactor0 + 3;
  lVar2 = 0;
  do {
    lVar10 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar10) = pRVar9[lVar10 * 4 + -3];
      *(RK_U8 *)((long)&local_78 + lVar10 + 4) = pRVar9[lVar10 * 4 + -2];
      *(RK_U8 *)((long)&uStack_70 + lVar10) = pRVar9[lVar10 * 4 + -1];
      *(RK_U8 *)((long)&uStack_70 + lVar10 + 4) = pRVar9[lVar10 * 4];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    *(undefined8 *)(pScalingFactor_out->scalingfactor0 + lVar2 * 0x10) = local_78;
    *(undefined8 *)(pScalingFactor_out->scalingfactor0 + lVar2 * 0x10 + 8) = uStack_70;
    lVar2 = lVar2 + 1;
    pRVar9 = pRVar9 + 0x10;
  } while (lVar2 != 6);
  pRVar9 = pScalingFactor_out->scalingfactor0 + 0x67;
  lVar2 = 0;
  do {
    pRVar6 = pScalingFactor_out->scalingfactor0 + lVar2 * 0x40 + 0x60;
    lVar10 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar10) = pRVar9[lVar10 * 8 + -7];
      *(RK_U8 *)((long)&uStack_70 + lVar10) = pRVar9[lVar10 * 8 + -6];
      *(RK_U8 *)((long)&local_68 + lVar10) = pRVar9[lVar10 * 8 + -5];
      *(RK_U8 *)((long)&uStack_60 + lVar10) = pRVar9[lVar10 * 8 + -4];
      *(RK_U8 *)((long)&local_58 + lVar10) = pRVar9[lVar10 * 8 + -3];
      tmpBuf[lVar10 + -8] = pRVar9[lVar10 * 8 + -2];
      tmpBuf[lVar10] = pRVar9[lVar10 * 8 + -1];
      tmpBuf[lVar10 + 8] = pRVar9[lVar10 * 8];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    *(undefined8 *)(pRVar6 + 0x30) = tmpBuf._0_8_;
    *(undefined8 *)(pRVar6 + 0x38) = tmpBuf._8_8_;
    *(undefined8 *)(pRVar6 + 0x20) = local_58;
    *(undefined8 *)(pRVar6 + 0x28) = uStack_50;
    *(undefined8 *)(pRVar6 + 0x10) = local_68;
    *(undefined8 *)(pRVar6 + 0x18) = uStack_60;
    *(undefined8 *)pRVar6 = local_78;
    *(undefined8 *)(pRVar6 + 8) = uStack_70;
    lVar2 = lVar2 + 1;
    pRVar9 = pRVar9 + 0x40;
  } while (lVar2 != 6);
  pRVar9 = pScalingFactor_out->scalingfactor0 + 0x1e7;
  lVar2 = 0;
  do {
    pRVar6 = pScalingFactor_out->scalingfactor0 + lVar2 * 0x40 + 0x1e0;
    lVar10 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar10) = pRVar9[lVar10 * 8 + -7];
      *(RK_U8 *)((long)&uStack_70 + lVar10) = pRVar9[lVar10 * 8 + -6];
      *(RK_U8 *)((long)&local_68 + lVar10) = pRVar9[lVar10 * 8 + -5];
      *(RK_U8 *)((long)&uStack_60 + lVar10) = pRVar9[lVar10 * 8 + -4];
      *(RK_U8 *)((long)&local_58 + lVar10) = pRVar9[lVar10 * 8 + -3];
      tmpBuf[lVar10 + -8] = pRVar9[lVar10 * 8 + -2];
      tmpBuf[lVar10] = pRVar9[lVar10 * 8 + -1];
      tmpBuf[lVar10 + 8] = pRVar9[lVar10 * 8];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    *(undefined8 *)(pRVar6 + 0x30) = tmpBuf._0_8_;
    *(undefined8 *)(pRVar6 + 0x38) = tmpBuf._8_8_;
    *(undefined8 *)(pRVar6 + 0x20) = local_58;
    *(undefined8 *)(pRVar6 + 0x28) = uStack_50;
    *(undefined8 *)(pRVar6 + 0x10) = local_68;
    *(undefined8 *)(pRVar6 + 0x18) = uStack_60;
    *(undefined8 *)pRVar6 = local_78;
    *(undefined8 *)(pRVar6 + 8) = uStack_70;
    lVar2 = lVar2 + 1;
    pRVar9 = pRVar9 + 0x40;
  } while (lVar2 != 6);
  pRVar9 = pScalingFactor_out->scalingfactor0 + 0x367;
  lVar2 = 0;
  do {
    pRVar6 = pScalingFactor_out->scalingfactor0 + lVar2 * 0x40 + 0x360;
    lVar10 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar10) = pRVar9[lVar10 * 8 + -7];
      *(RK_U8 *)((long)&uStack_70 + lVar10) = pRVar9[lVar10 * 8 + -6];
      *(RK_U8 *)((long)&local_68 + lVar10) = pRVar9[lVar10 * 8 + -5];
      *(RK_U8 *)((long)&uStack_60 + lVar10) = pRVar9[lVar10 * 8 + -4];
      *(RK_U8 *)((long)&local_58 + lVar10) = pRVar9[lVar10 * 8 + -3];
      tmpBuf[lVar10 + -8] = pRVar9[lVar10 * 8 + -2];
      tmpBuf[lVar10] = pRVar9[lVar10 * 8 + -1];
      tmpBuf[lVar10 + 8] = pRVar9[lVar10 * 8];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    *(undefined8 *)(pRVar6 + 0x30) = tmpBuf._0_8_;
    *(undefined8 *)(pRVar6 + 0x38) = tmpBuf._8_8_;
    *(undefined8 *)(pRVar6 + 0x20) = local_58;
    *(undefined8 *)(pRVar6 + 0x28) = uStack_50;
    *(undefined8 *)(pRVar6 + 0x10) = local_68;
    *(undefined8 *)(pRVar6 + 0x18) = uStack_60;
    *(undefined8 *)pRVar6 = local_78;
    *(undefined8 *)(pRVar6 + 8) = uStack_70;
    lVar2 = lVar2 + 1;
    pRVar9 = pRVar9 + 0x40;
  } while (lVar2 != 6);
  pRVar9 = pScalingFactor_out->scalingfactor1 + 3;
  lVar2 = 0;
  do {
    lVar10 = 0;
    do {
      *(RK_U8 *)((long)&local_78 + lVar10) = pRVar9[lVar10 * 4 + -3];
      *(RK_U8 *)((long)&local_78 + lVar10 + 4) = pRVar9[lVar10 * 4 + -2];
      *(RK_U8 *)((long)&uStack_70 + lVar10) = pRVar9[lVar10 * 4 + -1];
      *(RK_U8 *)((long)&uStack_70 + lVar10 + 4) = pRVar9[lVar10 * 4];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    *(undefined8 *)(pScalingFactor_out->scalingfactor1 + lVar2 * 0x10) = local_78;
    *(undefined8 *)(pScalingFactor_out->scalingfactor1 + lVar2 * 0x10 + 8) = uStack_70;
    lVar2 = lVar2 + 1;
    pRVar9 = pRVar9 + 0x10;
  } while (lVar2 != 6);
  return;
}

Assistant:

void hal_record_scaling_list(scalingFactor_t *pScalingFactor_out, scalingList_t *pScalingList)
{
    RK_S32 i;
    RK_U32 g_scalingListNum_model[SCALING_LIST_SIZE_NUM] = {6, 6, 6, 2}; // from C Model
    RK_U32 nIndex = 0;
    RK_U32 sizeId, matrixId, listId;
    RK_U8 *p = pScalingFactor_out->scalingfactor0;
    RK_U8 tmpBuf[8 * 8];

    //output non-default scalingFactor Table (1248 BYTES)
    for (sizeId = 0; sizeId < SCALING_LIST_SIZE_NUM; sizeId++) {
        for (listId = 0; listId < g_scalingListNum_model[sizeId]; listId++) {
            if (sizeId < 3) {
                for (i = 0; i < (sizeId == 0 ? 16 : 64); i++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = (RK_U8)pScalingList->sl[sizeId][listId][i];
                }
            } else {
                for (i = 0; i < 64; i ++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = (RK_U8)pScalingList->sl[sizeId][listId][i];
                }
                for (i = 0; i < 128; i ++) {
                    pScalingFactor_out->scalingfactor0[nIndex++] = 0;
                }
            }
        }
    }
    //output non-default scalingFactor Table Rotation(96 Bytes)
    nIndex = 0;
    for (listId = 0; listId < g_scalingListNum_model[0]; listId++) {
        RK_U8 temp16[16] = {0};
        for (i = 0; i < 16; i ++) {
            temp16[i] = (RK_U8)pScalingList->sl[0][listId][i];
        }
        for (i = 0; i < 4; i ++) {
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 4];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 8];
            pScalingFactor_out->scalingfactor1[nIndex++] = temp16[i + 12];
        }
    }
    //output non-default ScalingList_DC_Coeff (12 BYTES)
    nIndex = 0;
    for (listId = 0; listId < g_scalingListNum_model[2]; listId++) { //sizeId = 2
        pScalingFactor_out->scalingdc[nIndex++] = (RK_U8)pScalingList->sl_dc[0][listId];// zrh warning: sl_dc differed from scalingList->getScalingListDC
    }
    for (listId = 0; listId < g_scalingListNum_model[3]; listId++) { //sizeId = 3
        pScalingFactor_out->scalingdc[nIndex++] = (RK_U8)pScalingList->sl_dc[1][listId];// zrh warning: sl_dc differed from scalingList->getScalingListDC
        pScalingFactor_out->scalingdc[nIndex++] = 0;
        pScalingFactor_out->scalingdc[nIndex++] = 0;
    }

    //align 16X address
    nIndex = 0;
    for (i = 0; i < 4; i ++) {
        pScalingFactor_out->reserverd[nIndex++] = 0;
    }

    //----------------------All above code show the normal store way in HM--------------------------
    //--------from now on, the scalingfactor0 is rotated 90', the scalingfactor1 is also rotated 90'

    //sizeId == 0
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + matrixId * 16;

        for (i = 0; i < 4; i++) {
            tmpBuf[4 * 0 + i] = p[i * 4 + 0];
            tmpBuf[4 * 1 + i] = p[i * 4 + 1];
            tmpBuf[4 * 2 + i] = p[i * 4 + 2];
            tmpBuf[4 * 3 + i] = p[i * 4 + 3];
        }
        memcpy(p, tmpBuf, 4 * 4 * sizeof(RK_U8));
    }
    //sizeId == 1
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }
    //sizeId == 2
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + 6 * 64 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }
    //sizeId == 3
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor0 + 6 * 16 + 6 * 64 + 6 * 64 + matrixId * 64;

        for (i = 0; i < 8; i++) {
            tmpBuf[8 * 0 + i] = p[i * 8 + 0];
            tmpBuf[8 * 1 + i] = p[i * 8 + 1];
            tmpBuf[8 * 2 + i] = p[i * 8 + 2];
            tmpBuf[8 * 3 + i] = p[i * 8 + 3];
            tmpBuf[8 * 4 + i] = p[i * 8 + 4];
            tmpBuf[8 * 5 + i] = p[i * 8 + 5];
            tmpBuf[8 * 6 + i] = p[i * 8 + 6];
            tmpBuf[8 * 7 + i] = p[i * 8 + 7];
        }
        memcpy(p, tmpBuf, 8 * 8 * sizeof(RK_U8));
    }

    //sizeId == 0
    for (matrixId = 0; matrixId < 6; matrixId++) {
        p = pScalingFactor_out->scalingfactor1 + matrixId * 16;

        for (i = 0; i < 4; i++) {
            tmpBuf[4 * 0 + i] = p[i * 4 + 0];
            tmpBuf[4 * 1 + i] = p[i * 4 + 1];
            tmpBuf[4 * 2 + i] = p[i * 4 + 2];
            tmpBuf[4 * 3 + i] = p[i * 4 + 3];
        }
        memcpy(p, tmpBuf, 4 * 4 * sizeof(RK_U8));
    }
}